

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkFile
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  FileOptions *pFVar3;
  DescriptorProto *proto_00;
  FieldDescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  ServiceDescriptorProto *proto_03;
  int local_30;
  int local_2c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  if (*(long *)(file + 0xa0) == 0) {
    pFVar3 = FileOptions::default_instance();
    *(FileOptions **)(file + 0xa0) = pFVar3;
  }
  i_2 = 0;
  while( true ) {
    iVar2 = FileDescriptor::message_type_count(file);
    if (iVar2 <= i_2) break;
    lVar1 = *(long *)(file + 0x60);
    proto_00 = FileDescriptorProto::message_type(proto,i_2);
    CrossLinkMessage(this,(Descriptor *)(lVar1 + (long)i_2 * 0xa8),proto_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar2 = FileDescriptor::extension_count(file);
    if (iVar2 <= i_3) break;
    lVar1 = *(long *)(file + 0x98);
    proto_01 = FileDescriptorProto::extension(proto,i_3);
    CrossLinkField(this,(FieldDescriptor *)(lVar1 + (long)i_3 * 0xa8),proto_01);
    i_3 = i_3 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar2 = FileDescriptor::enum_type_count(file);
    if (iVar2 <= local_2c) break;
    lVar1 = *(long *)(file + 0x70);
    proto_02 = FileDescriptorProto::enum_type(proto,local_2c);
    CrossLinkEnum(this,(EnumDescriptor *)(lVar1 + (long)local_2c * 0x38),proto_02);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar2 = FileDescriptor::service_count(file);
    if (iVar2 <= local_30) break;
    lVar1 = *(long *)(file + 0x80);
    proto_03 = FileDescriptorProto::service(proto,local_30);
    CrossLinkService(this,(ServiceDescriptor *)(lVar1 + (long)local_30 * 0x30),proto_03);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkFile(
    FileDescriptor* file, const FileDescriptorProto& proto) {
  if (file->options_ == NULL) {
    file->options_ = &FileOptions::default_instance();
  }

  for (int i = 0; i < file->message_type_count(); i++) {
    CrossLinkMessage(&file->message_types_[i], proto.message_type(i));
  }

  for (int i = 0; i < file->extension_count(); i++) {
    CrossLinkField(&file->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    CrossLinkEnum(&file->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < file->service_count(); i++) {
    CrossLinkService(&file->services_[i], proto.service(i));
  }
}